

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

deUint32 deqp::gles3::Functional::UniformCase::randomFeatures(deUint32 seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined1 local_1c [4];
  deUint32 result;
  Random rnd;
  deUint32 seed_local;
  
  rnd.m_rnd.z = seed;
  de::Random::Random((Random *)local_1c,seed);
  iVar8 = de::Random::getInt((Random *)local_1c,0,1);
  uVar1 = randomFeatures::arrayUsageChoices[iVar8];
  iVar8 = de::Random::getInt((Random *)local_1c,0,1);
  uVar2 = randomFeatures::uniformFuncChoices[iVar8];
  iVar8 = de::Random::getInt((Random *)local_1c,0,1);
  uVar3 = randomFeatures::matrixModeChoices[iVar8];
  iVar8 = de::Random::getInt((Random *)local_1c,0,2);
  uVar4 = randomFeatures::arrayAssignChoices[iVar8];
  iVar8 = de::Random::getInt((Random *)local_1c,0,1);
  uVar5 = randomFeatures::uniformUsageChoices[iVar8];
  iVar8 = de::Random::getInt((Random *)local_1c,0,2);
  uVar6 = randomFeatures::booleanApiTypeChoices[iVar8];
  iVar8 = de::Random::getInt((Random *)local_1c,0,1);
  uVar7 = randomFeatures::uniformValueChoices[iVar8];
  de::Random::~Random((Random *)local_1c);
  return uVar7 | uVar1 | uVar2 | uVar3 | uVar4 | uVar5 | uVar6;
}

Assistant:

deUint32 UniformCase::randomFeatures (const deUint32 seed)
{
	static const deUint32 arrayUsageChoices[]		= { 0, FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX										};
	static const deUint32 uniformFuncChoices[]		= { 0, FEATURE_UNIFORMFUNC_VALUE												};
	static const deUint32 matrixModeChoices[]		= { 0, FEATURE_MATRIXMODE_ROWMAJOR												};
	static const deUint32 arrayAssignChoices[]		= { 0, FEATURE_ARRAYASSIGN_FULL,			FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	};
	static const deUint32 uniformUsageChoices[]		= { 0, FEATURE_UNIFORMUSAGE_EVERY_OTHER											};
	static const deUint32 booleanApiTypeChoices[]	= { 0, FEATURE_BOOLEANAPITYPE_INT,			FEATURE_BOOLEANAPITYPE_UINT			};
	static const deUint32 uniformValueChoices[]		= { 0, FEATURE_UNIFORMVALUE_ZERO												};

	Random rnd(seed);

	deUint32 result = 0;

#define ARRAY_CHOICE(ARR) ((ARR)[rnd.getInt(0, DE_LENGTH_OF_ARRAY(ARR)-1)])

	result |= ARRAY_CHOICE(arrayUsageChoices);
	result |= ARRAY_CHOICE(uniformFuncChoices);
	result |= ARRAY_CHOICE(matrixModeChoices);
	result |= ARRAY_CHOICE(arrayAssignChoices);
	result |= ARRAY_CHOICE(uniformUsageChoices);
	result |= ARRAY_CHOICE(booleanApiTypeChoices);
	result |= ARRAY_CHOICE(uniformValueChoices);

#undef ARRAY_CHOICE

	return result;
}